

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_data.hpp
# Opt level: O2

string * __thiscall
duckdb::MultiFileColumnDefinition::GetIdentifierName_abi_cxx11_
          (string *__return_storage_ptr__,MultiFileColumnDefinition *this)

{
  if ((this->identifier).is_null == true) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  }
  else {
    Value::GetValue<std::__cxx11::string>(__return_storage_ptr__,&this->identifier);
  }
  return __return_storage_ptr__;
}

Assistant:

string GetIdentifierName() const {
		if (identifier.IsNull()) {
			// No identifier was provided, assume the name as the identifier
			return name;
		}
		D_ASSERT(identifier.type().id() == LogicalTypeId::VARCHAR);
		return identifier.GetValue<string>();
	}